

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O0

bool __thiscall Assimp::ASE::Parser::SkipSection(Parser *this)

{
  bool bVar1;
  int local_1c;
  int iCnt;
  Parser *this_local;
  
  local_1c = 0;
  do {
    if (*this->filePtr == '}') {
      local_1c = local_1c + -1;
      if (local_1c == 0) {
        this->filePtr = this->filePtr + 1;
        SkipToNextToken(this);
        return true;
      }
    }
    else if (*this->filePtr == '{') {
      local_1c = local_1c + 1;
    }
    else {
      if (*this->filePtr == '\0') {
        LogWarning(this,
                   "Unable to parse block: Unexpected EOF, closing bracket \'}\' was expected [#1]")
        ;
        return false;
      }
      bVar1 = IsLineEnd<char>(*this->filePtr);
      if (bVar1) {
        this->iLineNumber = this->iLineNumber + 1;
      }
    }
    this->filePtr = this->filePtr + 1;
  } while( true );
}

Assistant:

bool Parser::SkipSection()
{
    // must handle subsections ...
    int iCnt = 0;
    while (true)
    {
        if ('}' == *filePtr)
        {
            --iCnt;
            if (0 == iCnt)
            {
                // go to the next valid token ...
                ++filePtr;
                SkipToNextToken();
                return true;
            }
        }
        else if ('{' == *filePtr)
        {
            ++iCnt;
        }
        else if ('\0' == *filePtr)
        {
            LogWarning("Unable to parse block: Unexpected EOF, closing bracket \'}\' was expected [#1]");
            return false;
        }
        else if(IsLineEnd(*filePtr))++iLineNumber;
        ++filePtr;
    }
}